

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O1

int bcf_sr_set_regions(bcf_srs_t *readers,char *regions,int is_file)

{
  bcf_sr_regions_t *pbVar1;
  
  if (readers->regions != (bcf_sr_regions_t *)0x0) {
    __assert_fail("!readers->regions",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/synced_bcf_reader.c"
                  ,0x6a,"int bcf_sr_set_regions(bcf_srs_t *, const char *, int)");
  }
  if (readers->nreaders == 0) {
    pbVar1 = bcf_sr_regions_init(regions,is_file,0,1,-2);
    readers->regions = pbVar1;
    if (pbVar1 != (bcf_sr_regions_t *)0x0) {
      readers->explicit_regs = 1;
      readers->require_index = 1;
      return 0;
    }
  }
  else {
    bcf_sr_set_regions_cold_1();
  }
  return -1;
}

Assistant:

int bcf_sr_set_regions(bcf_srs_t *readers, const char *regions, int is_file)
{
    assert( !readers->regions );
    if ( readers->nreaders )
    {
        fprintf(stderr,"[%s:%d %s] Error: bcf_sr_set_regions() must be called before bcf_sr_add_reader()\n", __FILE__,__LINE__,__FUNCTION__);
        return -1;
    }
    readers->regions = bcf_sr_regions_init(regions,is_file,0,1,-2);
    if ( !readers->regions ) return -1;
    readers->explicit_regs = 1;
    readers->require_index = 1;
    return 0;
}